

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O0

void __thiscall Liby::TcpClient::destroy(TcpClient *this)

{
  TcpClient *this_local;
  
  this->poller_ = (Poller *)0x0;
  this->loop_ = (EventLoop *)0x0;
  std::__shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>);
  std::function<void_(std::shared_ptr<Liby::Connection>)>::operator=
            (&this->connector_,(nullptr_t)0x0);
  std::__shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->self_).super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void TcpClient::destroy() {
    poller_ = nullptr;
    loop_ = nullptr;
    chan_.reset();
    socket_
        .reset(); // socket_.reset必须在chan_之后,确保chan_析构时其使用的fd是有效的
    connector_ = nullptr;
    self_.reset();
}